

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

void __thiscall covenant::CFGConnect::scc(CFGConnect *this,CFG *g)

{
  pointer pvVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  cleanup(this,(EVP_PKEY_CTX *)g);
  SCC_Init(this,g);
  SCC_Compute(this,(int)(((long)(this->verts).
                                super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->verts).
                               super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28) + -1);
  std::vector<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>::
  pop_back(&this->verts);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::pop_back(&this->groups);
  uVar2 = 0;
  while( true ) {
    uVar4 = (ulong)uVar2;
    pvVar1 = (this->groups).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->groups).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
    if ((ulong)(lVar3 / 0x18) <= uVar4) break;
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar1[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               *(pointer *)
                ((long)&pvVar1[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8),lVar3 % 0x18);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void scc(CFG& g){
      cleanup();
      SCC_Init(g);
      SCC_Compute(verts.size()-1);
      
      // Eliminate the fake vertex.
      verts.pop_back();
      groups.pop_back();

      // Sort to make queries more efficient
      for (unsigned int i=0; i < groups.size(); i++){
	sort(groups[i].begin(), groups[i].end());
      }
    }